

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getMemoryBufferForStream
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,int FD,Twine *BufferName)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  undefined8 uVar4;
  size_t MinCapacity;
  char *__buf;
  StringRef InputData;
  SmallString<16384U> Buffer;
  SmallVectorBase local_4040;
  char local_4030 [16384];
  
  local_4040.Size = 0;
  local_4040.Capacity = 0x4000;
  local_4040.BeginX = local_4030;
  do {
    MinCapacity = (local_4040._8_8_ & 0xffffffff) + 0x4000;
    if ((ulong)local_4040._8_8_ >> 0x20 < MinCapacity) {
      llvm::SmallVectorBase::grow_pod(&local_4040,local_4030,MinCapacity,1);
    }
    __buf = (char *)((long)local_4040.BeginX + (local_4040._8_8_ & 0xffffffff));
    piVar2 = __errno_location();
    while( true ) {
      *piVar2 = 0;
      sVar3 = read(FD,__buf,0x4000);
      if (sVar3 != -1) break;
      if (*piVar2 != 4) {
        iVar1 = *piVar2;
        uVar4 = std::_V2::generic_category();
        __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
        *(int *)&__return_storage_ptr__->field_0 = iVar1;
        *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar4;
        goto LAB_00179285;
      }
    }
    InputData.Length = (local_4040._8_8_ & 0xffffffff) + sVar3;
    if (local_4040.Capacity < InputData.Length) {
      __assert_fail("Size <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    local_4040.Size = (int)InputData.Length;
  } while (sVar3 != 0);
  InputData.Data = (char *)local_4040.BeginX;
  getMemBufferCopyImpl(__return_storage_ptr__,InputData,BufferName);
LAB_00179285:
  if ((char *)local_4040.BeginX != local_4030) {
    free(local_4040.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<WritableMemoryBuffer>>
getMemoryBufferForStream(int FD, const Twine &BufferName) {
  const ssize_t ChunkSize = 4096*4;
  SmallString<ChunkSize> Buffer;
  ssize_t ReadBytes;
  // Read into Buffer until we hit EOF.
  do {
    Buffer.reserve(Buffer.size() + ChunkSize);
    ReadBytes = sys::RetryAfterSignal(-1, ::read, FD, Buffer.end(), ChunkSize);
    if (ReadBytes == -1)
      return std::error_code(errno, std::generic_category());
    Buffer.set_size(Buffer.size() + ReadBytes);
  } while (ReadBytes != 0);

  return getMemBufferCopyImpl(Buffer, BufferName);
}